

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

TypeGenericClass * __thiscall
ExpressionContext::GetGenericClassType
          (ExpressionContext *this,SynBase *source,TypeGenericClassProto *proto,
          IntrusiveList<TypeHandle> generics)

{
  TypeHandle *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  IntrusiveList<TypeHandle> *pIVar4;
  TypeHandle *pTVar5;
  ulong uVar6;
  InplaceStr name;
  TypeGenericClass *result;
  TypeGenericClass *local_38;
  TypeGenericClass *pTVar3;
  
  uVar6 = 0;
  do {
    if (uVar6 == (this->genericClassTypes).count) {
      iVar2 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x78);
      pTVar3 = (TypeGenericClass *)CONCAT44(extraout_var,iVar2);
      name = GetGenericClassTypeName(this,&proto->super_TypeBase,generics);
      TypeGenericClass::TypeGenericClass(pTVar3,name,proto,generics);
      result = pTVar3;
      if ((uint)(*(int *)&(pTVar3->super_TypeBase).name.end -
                *(int *)&(pTVar3->super_TypeBase).name.begin) < 0x2001) {
        SmallArray<TypeGenericClass_*,_128U>::push_back(&this->genericClassTypes,&result);
        local_38 = result;
        SmallArray<TypeBase_*,_128U>::push_back(&this->types,(TypeBase **)&local_38);
        return result;
      }
      Stop(this,source,"ERROR: generated generic type name exceeds maximum type length \'%d\'",
           0x2000);
    }
    pTVar3 = (this->genericClassTypes).data[uVar6];
    if ((pTVar3 != (TypeGenericClass *)0x0) && (pTVar3->proto == proto)) {
      pIVar4 = &pTVar3->generics;
      for (pTVar5 = generics.head;
          ((pTVar1 = pIVar4->head, pTVar1 != (TypeHandle *)0x0 && (pTVar5 != (TypeHandle *)0x0)) &&
          (pTVar1->type == pTVar5->type)); pTVar5 = pTVar5->next) {
        pIVar4 = (IntrusiveList<TypeHandle> *)&pTVar1->next;
      }
      if (pTVar1 == pTVar5) {
        return pTVar3;
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

TypeGenericClass* ExpressionContext::GetGenericClassType(SynBase *source, TypeGenericClassProto *proto, IntrusiveList<TypeHandle> generics)
{
	for(unsigned i = 0, e = genericClassTypes.count; i < e; i++)
	{
		if(TypeGenericClass *type = genericClassTypes.data[i])
		{
			if(type->proto != proto)
				continue;

			TypeHandle *leftArg = type->generics.head;
			TypeHandle *rightArg = generics.head;

			while(leftArg && rightArg && leftArg->type == rightArg->type)
			{
				leftArg = leftArg->next;
				rightArg = rightArg->next;
			}

			if(leftArg != rightArg)
				continue;

			return type;
		}
	}

	// Create new type
	TypeGenericClass *result = new (get<TypeGenericClass>()) TypeGenericClass(GetGenericClassTypeName(*this, proto, generics), proto, generics);

	if(result->name.length() > NULLC_MAX_TYPE_NAME_LENGTH)
		Stop(source, "ERROR: generated generic type name exceeds maximum type length '%d'", NULLC_MAX_TYPE_NAME_LENGTH);

	genericClassTypes.push_back(result);
	types.push_back(result);

	return result;
}